

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwaLookups.cpp
# Opt level: O2

void generateNoop(void)

{
  int i;
  uint uVar1;
  unsigned_short dst;
  char *tmp;
  
  puts("const unsigned short dwaCompressorNoOp[] = ");
  putchar(0x7b);
  for (uVar1 = 0; uVar1 != 0x10000; uVar1 = uVar1 + 1) {
    if ((uVar1 & 7) == 0) {
      printf("\n    ");
    }
    tmp = (char *)&dst;
    Imf::Xdr::write<Imf::CharPtrIO,char*>(&tmp,(unsigned_short)uVar1);
    printf("0x%04x, ",(ulong)dst);
  }
  puts("\n};");
  return;
}

Assistant:

void
generateNoop()
{
    printf("const unsigned short dwaCompressorNoOp[] = \n");
    printf("{");
    for (int i=0; i<65536; ++i) {

        if (i % 8 == 0) {
            printf("\n    ");
        }

        unsigned short dst;
        char *tmp = (char *)(&dst);

        unsigned short src = (unsigned short)i;
        Xdr::write <CharPtrIO> (tmp,  src);

        printf("0x%04x, ", dst);
    }
    printf("\n};\n");
}